

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

ReservedRange *
google::protobuf::descriptor_unittest::AddReservedRange(DescriptorProto *parent,int start,int end)

{
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>_>
  *pVVar1;
  
  pVVar1 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto_ReservedRange>>
                     (&(parent->field_0)._impl_.reserved_range_.super_RepeatedPtrFieldBase);
  (pVVar1->field_0)._impl_.start_ = start;
  (pVVar1->field_0)._impl_.end_ = end;
  *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 3;
  return pVVar1;
}

Assistant:

DescriptorProto::ReservedRange* AddReservedRange(DescriptorProto* parent,
                                                 int start, int end) {
  DescriptorProto::ReservedRange* result = parent->add_reserved_range();
  result->set_start(start);
  result->set_end(end);
  return result;
}